

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

ImplicitWeakMessage * __thiscall
google::protobuf::Arena::DoCreateMessage<google::protobuf::internal::ImplicitWeakMessage>
          (Arena *this)

{
  void *ptr;
  ImplicitWeakMessage *pIVar1;
  Arena *local_18;
  Arena *local_10;
  Arena *this_local;
  
  local_10 = this;
  ptr = AllocateInternal(this,0x30,8,
                         internal::
                         arena_destruct_object<google::protobuf::internal::ImplicitWeakMessage>,
                         (type_info *)&internal::ImplicitWeakMessage::typeinfo);
  local_18 = this;
  pIVar1 = InternalHelper<google::protobuf::internal::ImplicitWeakMessage>::
           Construct<google::protobuf::Arena*>(ptr,&local_18);
  return pIVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }